

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textreader.hpp
# Opt level: O0

void __thiscall TextReader::parse_dec(TextReader *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  allocator local_31;
  string local_30 [32];
  TextReader *local_10;
  TextReader *this_local;
  
  this->current_token_len_ = this->current_token_len_ + 1;
  local_10 = this;
  while( true ) {
    sVar1 = this->current_token_pos_;
    sVar2 = this->current_token_len_;
    uVar4 = std::__cxx11::string::size();
    bVar3 = false;
    if (sVar1 + sVar2 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
      bVar3 = false;
      if ('/' < *pcVar5) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_);
        bVar3 = *pcVar5 < ':';
      }
    }
    if (!bVar3) break;
    this->current_token_len_ = this->current_token_len_ + 1;
  }
  sVar1 = this->current_token_pos_;
  sVar2 = this->current_token_len_;
  uVar4 = std::__cxx11::string::size();
  if ((sVar1 + sVar2 < uVar4) &&
     ((((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        '/' < *pcVar5 &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        *pcVar5 < ':')) ||
       ((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        '@' < *pcVar5 &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        *pcVar5 < '[')))) ||
      (((pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        '`' < *pcVar5 &&
        (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
        *pcVar5 < '{')) ||
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&this->current_line_),
       *pcVar5 == '_')))))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Invalid symbol in decimal value",&local_31);
    parse_error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

inline void parse_dec() {
        current_token_len_++;
        while (current_token_pos_ + current_token_len_ < current_line_.size() &&
               _is_dec_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            current_token_len_++;
        };
        if (current_token_pos_ + current_token_len_ < current_line_.size() &&
            _is_literal_symbol(current_line_[current_token_pos_ + current_token_len_])) {
            parse_error(ERROR_DEC_INVALID_SYMBOL);
        };
    }